

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsException.h
# Opt level: O0

void __thiscall AdsException::~AdsException(AdsException *this)

{
  AdsException *this_local;
  
  ~AdsException(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AdsException() throw (){}